

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<metaf::Temperature> metaf::Temperature::fromString(string *s)

{
  bool bVar1;
  _Storage<unsigned_int,_true> _Var2;
  optional<unsigned_int> oVar3;
  _Optional_payload_base<unsigned_int> _Var4;
  ulong uVar5;
  undefined8 uVar6;
  optional<metaf::Temperature> oVar7;
  
  bVar1 = std::operator==(s,"//");
  if (bVar1) {
    uVar6 = 0x100000000;
  }
  else {
    if (s->_M_string_length == 2) {
      uVar6 = 0;
      _Var4 = (_Optional_payload_base<unsigned_int>)strToUint(s,0,2);
      _Var2._M_value = 0;
      uVar5 = 0;
      if (((ulong)_Var4 & 0x100000000) == 0) goto LAB_0018c744;
      uVar6 = 0x100000000;
LAB_0018c782:
      _Var2 = _Var4._M_payload;
      uVar5 = 0x100000000;
      goto LAB_0018c744;
    }
    if ((s->_M_string_length == 3) && (*(s->_M_dataplus)._M_p == 'M')) {
      oVar3 = strToUint(s,1,2);
      if (((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> & 0x100000000) != 0) {
        _Var4 = (_Optional_payload_base<unsigned_int>)
                -(long)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int>;
        uVar6 = 0x100000001;
        goto LAB_0018c782;
      }
    }
    uVar6 = 0;
  }
  _Var2._M_value = 0;
  uVar5 = 0;
LAB_0018c744:
  oVar7.super__Optional_base<metaf::Temperature,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Temperature>._M_payload._0_8_ = _Var2._M_value | uVar5;
  oVar7.super__Optional_base<metaf::Temperature,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Temperature>._8_8_ = uVar6;
  return (optional<metaf::Temperature>)
         oVar7.super__Optional_base<metaf::Temperature,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::Temperature>;
}

Assistant:

std::optional<Temperature> Temperature::fromString(const std::string & s) {
	//static const std::regex rgx ("(?:(M)?(\\d\\d))|//");
	std::optional<Temperature> error;
	if (s == "//") return Temperature();
	if (s.length() == 3) {
		if (s[0] != 'M') return error;
		const auto t = strToUint(s, 1, 2);
		if (!t.has_value()) return error;
		Temperature temperature;
		temperature.tempValue = - *t;
		temperature.freezing = true;
		return temperature;
	}
	if (s.length() == 2) {
		const auto t = strToUint(s, 0, 2);
		if (!t.has_value()) return error;
		Temperature temperature;
		temperature.tempValue = *t;
		return temperature;
	}
	return error;
}